

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
OpenMD::EAMAdapter::getOF
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,EAMAdapter *this)

{
  ZhouParameters zhouParam;
  ZhouParameters ZStack_118;
  
  getZhouParam(&ZStack_118,this);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,&ZStack_118.OF);
  ZhouParameters::~ZhouParameters(&ZStack_118);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<RealType>> EAMAdapter::getOF() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.OF;
  }